

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_mf.cc
# Opt level: O0

void mf_print_offset_features(gdmf *d,example *ec,size_t offset)

{
  float fVar1;
  bool bVar2;
  ulong *puVar3;
  size_t sVar4;
  __shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
  *p_Var5;
  element_type *peVar6;
  ostream *poVar7;
  parameters *this;
  long *plVar8;
  feature_value *pfVar9;
  weight *pwVar10;
  undefined8 uVar11;
  int extraout_EDX;
  int extraout_EDX_00;
  int iVar12;
  int __c;
  int __c_00;
  int __c_01;
  int __c_02;
  int __c_03;
  int __c_04;
  int __c_05;
  int __c_06;
  int __c_07;
  int __c_08;
  long in_RDX;
  undefined8 in_RSI;
  char *pcVar13;
  long *in_RDI;
  stringstream __msg;
  iterator_all *f2;
  iterator_all __end5;
  iterator_all __begin5;
  features_value_index_audit_range *__range5;
  iterator_all *f1;
  iterator_all __end4;
  iterator_all __begin4;
  features_value_index_audit_range *__range4;
  size_t k;
  string *i;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  features_value_index_audit_iterator *f;
  iterator_all __end2;
  iterator_all __begin2;
  features_value_index_audit_range *__range2;
  bool audit;
  features *fs;
  iterator __end1;
  iterator __begin1;
  example *__range1;
  uint64_t mask;
  parameters *weights;
  vw *all;
  parameters *in_stack_fffffffffffffbe8;
  example_predict *in_stack_fffffffffffffbf0;
  parameters *in_stack_fffffffffffffbf8;
  string *in_stack_fffffffffffffc08;
  ostream *in_stack_fffffffffffffc10;
  char *in_stack_fffffffffffffc18;
  vw_exception *in_stack_fffffffffffffc20;
  stringstream local_300 [16];
  ostream local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_170;
  features_value_index_audit_iterator *local_168;
  features_value_iterator local_160 [3];
  features_value_index_audit_iterator local_148;
  features *local_130;
  features **local_128;
  features_value_index_audit_iterator *local_120;
  features_value_iterator local_118 [3];
  features_value_index_audit_iterator local_100;
  features *local_e8;
  features **local_e0;
  ulong local_d8;
  reference local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c0;
  long local_b8;
  features_value_index_audit_iterator *local_b0;
  features_value_iterator local_a8 [3];
  features_value_index_audit_iterator local_90;
  features *local_78;
  features **local_70;
  byte local_61;
  features *local_60;
  iterator local_58;
  iterator local_48;
  undefined8 local_38;
  uint64_t local_30;
  char *local_28;
  long local_20;
  long local_18;
  undefined8 local_10;
  long *local_8;
  
  local_20 = *in_RDI;
  local_28 = (char *)(local_20 + 0x3590);
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_30 = parameters::mask(in_stack_fffffffffffffbe8);
  local_38 = local_10;
  local_48 = example_predict::begin(in_stack_fffffffffffffbf0);
  local_58 = example_predict::end(in_stack_fffffffffffffbf0);
  while (bVar2 = example_predict::iterator::operator!=(&local_48,&local_58), bVar2) {
    local_60 = example_predict::iterator::operator*(&local_48);
    bVar2 = v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::empty(&local_60->space_names);
    local_61 = (bVar2 ^ 0xffU) & 1;
    local_78 = (features *)features::values_indices_audit((features *)in_stack_fffffffffffffbe8);
    local_70 = &local_78;
    features::features_value_index_audit_range::begin
              ((features_value_index_audit_range *)in_stack_fffffffffffffc08);
    features::features_value_index_audit_range::end
              ((features_value_index_audit_range *)in_stack_fffffffffffffc08);
    while (bVar2 = features_value_iterator::operator!=
                             ((features_value_iterator *)&local_90,local_a8), bVar2) {
      local_b0 = features_value_index_audit_iterator::operator*(&local_90);
      pcVar13 = (char *)0x9;
      std::operator<<((ostream *)&std::cout,'\t');
      iVar12 = extraout_EDX;
      if ((local_61 & 1) != 0) {
        p_Var5 = &features_value_index_audit_iterator::audit_abi_cxx11_(local_b0)->
                  super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ;
        peVar6 = std::
                 __shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 ::get(p_Var5);
        poVar7 = std::operator<<((ostream *)&std::cout,(string *)peVar6);
        poVar7 = std::operator<<(poVar7,'^');
        p_Var5 = &features_value_index_audit_iterator::audit_abi_cxx11_(local_b0)->
                  super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ;
        peVar6 = std::
                 __shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 ::get(p_Var5);
        poVar7 = std::operator<<(poVar7,(string *)&peVar6->second);
        pcVar13 = (char *)0x3a;
        std::operator<<(poVar7,':');
        iVar12 = extraout_EDX_00;
      }
      puVar3 = (ulong *)features_value_index_iterator::index
                                  (&local_b0->super_features_value_index_iterator,pcVar13,iVar12);
      poVar7 = (ostream *)std::ostream::operator<<(&std::cout,*puVar3);
      pcVar13 = "(";
      poVar7 = std::operator<<(poVar7,"(");
      plVar8 = (long *)features_value_index_iterator::index
                                 (&local_b0->super_features_value_index_iterator,pcVar13,__c);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,*plVar8 + local_18 & local_30);
      poVar7 = std::operator<<(poVar7,")");
      poVar7 = std::operator<<(poVar7,':');
      pfVar9 = features_value_iterator::value((features_value_iterator *)local_b0);
      std::ostream::operator<<(poVar7,*pfVar9);
      pcVar13 = (char *)0x3a;
      poVar7 = std::operator<<((ostream *)&std::cout,':');
      features_value_index_iterator::index
                (&local_b0->super_features_value_index_iterator,pcVar13,__c_00);
      pwVar10 = parameters::operator[](in_stack_fffffffffffffbf8,(size_t)in_stack_fffffffffffffbf0);
      std::ostream::operator<<(poVar7,pwVar10[local_18]);
      features_value_index_audit_iterator::operator++
                ((features_value_index_audit_iterator *)in_stack_fffffffffffffbf0);
    }
    example_predict::iterator::operator++(&local_48);
  }
  local_b8 = local_20 + 0x380;
  local_c0._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffbe8);
  local_c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffbe8);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffbf0,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffbe8);
    iVar12 = (int)((ulong)in_stack_fffffffffffffc10 >> 0x20);
    if (!bVar2) break;
    local_d0 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_c0);
    std::__cxx11::string::operator[]((ulong)local_d0);
    sVar4 = features::size((features *)0x23e5b9);
    if (sVar4 != 0) {
      std::__cxx11::string::operator[]((ulong)local_d0);
      sVar4 = features::size((features *)0x23e600);
      if (sVar4 != 0) {
        for (local_d8 = 1; local_d8 <= *(uint *)(local_8 + 5); local_d8 = local_d8 + 1) {
          std::__cxx11::string::operator[]((ulong)local_d0);
          local_e8 = (features *)
                     features::values_indices_audit((features *)in_stack_fffffffffffffbe8);
          local_e0 = &local_e8;
          features::features_value_index_audit_range::begin
                    ((features_value_index_audit_range *)in_stack_fffffffffffffc08);
          features::features_value_index_audit_range::end
                    ((features_value_index_audit_range *)in_stack_fffffffffffffc08);
          while (bVar2 = features_value_iterator::operator!=
                                   ((features_value_iterator *)&local_100,local_118), bVar2) {
            local_120 = features_value_index_audit_iterator::operator*(&local_100);
            std::__cxx11::string::operator[]((ulong)local_d0);
            local_130 = (features *)
                        features::values_indices_audit((features *)in_stack_fffffffffffffbe8);
            local_128 = &local_130;
            features::features_value_index_audit_range::begin
                      ((features_value_index_audit_range *)in_stack_fffffffffffffc08);
            features::features_value_index_audit_range::end
                      ((features_value_index_audit_range *)in_stack_fffffffffffffc08);
            while (bVar2 = features_value_iterator::operator!=
                                     ((features_value_iterator *)&local_148,local_160), bVar2) {
              local_168 = features_value_index_audit_iterator::operator*(&local_148);
              in_stack_fffffffffffffbf0 =
                   (example_predict *)std::operator<<((ostream *)&std::cout,'\t');
              p_Var5 = &features_value_index_audit_iterator::audit_abi_cxx11_(local_120)->
                        super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ;
              peVar6 = std::
                       __shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                       ::get(p_Var5);
              poVar7 = std::operator<<((ostream *)in_stack_fffffffffffffbf0,(string *)peVar6);
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_d8);
              this = (parameters *)std::operator<<(poVar7,'^');
              p_Var5 = &features_value_index_audit_iterator::audit_abi_cxx11_(local_120)->
                        super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ;
              peVar6 = std::
                       __shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                       ::get(p_Var5);
              poVar7 = std::operator<<((ostream *)this,(string *)&peVar6->second);
              pcVar13 = (char *)0x3a;
              poVar7 = std::operator<<(poVar7,':');
              plVar8 = (long *)features_value_index_iterator::index
                                         (&local_120->super_features_value_index_iterator,pcVar13,
                                          __c_01);
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,*plVar8 + local_d8 & local_30);
              pcVar13 = "(";
              in_stack_fffffffffffffc08 = (string *)std::operator<<(poVar7,"(");
              plVar8 = (long *)features_value_index_iterator::index
                                         (&local_120->super_features_value_index_iterator,pcVar13,
                                          __c_02);
              poVar7 = (ostream *)
                       std::ostream::operator<<
                                 (in_stack_fffffffffffffc08,*plVar8 + local_18 + local_d8 & local_30
                                 );
              poVar7 = std::operator<<(poVar7,")");
              in_stack_fffffffffffffc10 = std::operator<<(poVar7,':');
              pfVar9 = features_value_iterator::value((features_value_iterator *)local_120);
              std::ostream::operator<<(in_stack_fffffffffffffc10,*pfVar9);
              pcVar13 = (char *)0x3a;
              in_stack_fffffffffffffc20 = (vw_exception *)std::operator<<((ostream *)&std::cout,':')
              ;
              in_stack_fffffffffffffc18 = local_28;
              features_value_index_iterator::index
                        (&local_120->super_features_value_index_iterator,pcVar13,__c_03);
              pwVar10 = parameters::operator[](this,(size_t)in_stack_fffffffffffffbf0);
              std::ostream::operator<<(in_stack_fffffffffffffc20,pwVar10[local_18 + local_d8]);
              poVar7 = std::operator<<((ostream *)&std::cout,':');
              p_Var5 = &features_value_index_audit_iterator::audit_abi_cxx11_(local_168)->
                        super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ;
              peVar6 = std::
                       __shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                       ::get(p_Var5);
              poVar7 = std::operator<<(poVar7,(string *)peVar6);
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_d8);
              poVar7 = std::operator<<(poVar7,'^');
              p_Var5 = &features_value_index_audit_iterator::audit_abi_cxx11_(local_168)->
                        super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ;
              peVar6 = std::
                       __shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                       ::get(p_Var5);
              poVar7 = std::operator<<(poVar7,(string *)&peVar6->second);
              pcVar13 = (char *)0x3a;
              poVar7 = std::operator<<(poVar7,':');
              plVar8 = (long *)features_value_index_iterator::index
                                         (&local_168->super_features_value_index_iterator,pcVar13,
                                          __c_04);
              poVar7 = (ostream *)
                       std::ostream::operator<<
                                 (poVar7,*plVar8 + local_d8 + (ulong)*(uint *)(local_8 + 5) &
                                         local_30);
              pcVar13 = "(";
              poVar7 = std::operator<<(poVar7,"(");
              plVar8 = (long *)features_value_index_iterator::index
                                         (&local_168->super_features_value_index_iterator,pcVar13,
                                          __c_05);
              poVar7 = (ostream *)
                       std::ostream::operator<<
                                 (poVar7,*plVar8 + local_18 + local_d8 +
                                         (ulong)*(uint *)(local_8 + 5) & local_30);
              poVar7 = std::operator<<(poVar7,")");
              poVar7 = std::operator<<(poVar7,':');
              pfVar9 = features_value_iterator::value((features_value_iterator *)local_168);
              std::ostream::operator<<(poVar7,*pfVar9);
              pcVar13 = (char *)0x3a;
              poVar7 = std::operator<<((ostream *)&std::cout,':');
              features_value_index_iterator::index
                        (&local_168->super_features_value_index_iterator,pcVar13,__c_06);
              pwVar10 = parameters::operator[](this,(size_t)in_stack_fffffffffffffbf0);
              std::ostream::operator<<
                        (poVar7,pwVar10[local_18 + local_d8 + (ulong)*(uint *)(local_8 + 5)]);
              pcVar13 = (char *)0x3a;
              poVar7 = std::operator<<((ostream *)&std::cout,':');
              pcVar13 = features_value_index_iterator::index
                                  (&local_120->super_features_value_index_iterator,pcVar13,__c_07);
              pcVar13 = *(char **)pcVar13;
              pwVar10 = parameters::operator[](this,(size_t)in_stack_fffffffffffffbf0);
              fVar1 = pwVar10[local_18 + local_d8];
              features_value_index_iterator::index
                        (&local_168->super_features_value_index_iterator,pcVar13,__c_08);
              pwVar10 = parameters::operator[](this,(size_t)in_stack_fffffffffffffbf0);
              std::ostream::operator<<
                        (poVar7,fVar1 * pwVar10[local_18 + local_d8 + (ulong)*(uint *)(local_8 + 5)]
                        );
              features_value_index_audit_iterator::operator++
                        ((features_value_index_audit_iterator *)in_stack_fffffffffffffbf0);
            }
            features_value_index_audit_iterator::operator++
                      ((features_value_index_audit_iterator *)in_stack_fffffffffffffbf0);
          }
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_c0);
  }
  local_170 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffbe8);
  local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffbe8);
  bVar2 = __gnu_cxx::operator!=
                    ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)in_stack_fffffffffffffbf0,
                     (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)in_stack_fffffffffffffbe8);
  if (bVar2) {
    std::__cxx11::stringstream::stringstream(local_300);
    std::operator<<(&local_2f0,"cannot use triples in matrix factorization");
    uVar11 = __cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    VW::vw_exception::vw_exception
              (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,iVar12,in_stack_fffffffffffffc08)
    ;
    __cxa_throw(uVar11,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void mf_print_offset_features(gdmf& d, example& ec, size_t offset)
{
  vw& all = *d.all;
  parameters& weights = all.weights;
  uint64_t mask = weights.mask();
  for (features& fs : ec)
  {
    bool audit = !fs.space_names.empty();
    for (auto& f : fs.values_indices_audit())
    {
      cout << '\t';
      if (audit)
        cout << f.audit().get()->first << '^' << f.audit().get()->second << ':';
      cout << f.index() << "(" << ((f.index() + offset) & mask) << ")" << ':' << f.value();
      cout << ':' << (&weights[f.index()])[offset];
    }
  }
  for (string& i : all.pairs)
    if (ec.feature_space[(unsigned char)i[0]].size() > 0 && ec.feature_space[(unsigned char)i[1]].size() > 0)
    {
      /* print out nsk^feature:hash:value:weight:nsk^feature^:hash:value:weight:prod_weights */
      for (size_t k = 1; k <= d.rank; k++)
      {
        for (features::iterator_all& f1 : ec.feature_space[(unsigned char)i[0]].values_indices_audit())
          for (features::iterator_all& f2 : ec.feature_space[(unsigned char)i[1]].values_indices_audit())
          {
            cout << '\t' << f1.audit().get()->first << k << '^' << f1.audit().get()->second << ':'
                 << ((f1.index() + k) & mask) << "(" << ((f1.index() + offset + k) & mask) << ")" << ':' << f1.value();
            cout << ':' << (&weights[f1.index()])[offset + k];

            cout << ':' << f2.audit().get()->first << k << '^' << f2.audit().get()->second << ':'
                 << ((f2.index() + k + d.rank) & mask) << "(" << ((f2.index() + offset + k + d.rank) & mask) << ")"
                 << ':' << f2.value();
            cout << ':' << (&weights[f2.index()])[offset + k + d.rank];

            cout << ':' << (&weights[f1.index()])[offset + k] * (&weights[f2.index()])[offset + k + d.rank];
          }
      }
    }
  if (all.triples.begin() != all.triples.end())
    THROW("cannot use triples in matrix factorization");
  cout << endl;
}